

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O0

void __thiscall mp::QP2PassVisitor::DoAddConst(QP2PassVisitor *this,longdouble c)

{
  AffineExpr *pAVar1;
  QP2PassVisitor *in_RDI;
  undefined8 in_stack_00000008;
  
  pAVar1 = GetPAffineExpr(in_RDI);
  if (pAVar1 == (AffineExpr *)0x0) {
    if (in_RDI->pass_ == 2) {
      in_RDI->const_term_ = in_RDI->const_term_ + (longdouble)CONCAT28(c._0_2_,in_stack_00000008);
    }
  }
  else {
    pAVar1 = GetPAffineExpr(in_RDI);
    AlgebraicExpression<mp::LinTerms>::add_to_constant
              (pAVar1,(double)(longdouble)CONCAT28(c._0_2_,in_stack_00000008));
  }
  return;
}

Assistant:

void QP2PassVisitor::DoAddConst(long double c) {
  if (GetPAffineExpr()) {
    GetPAffineExpr()->add_to_constant(c);
  } else {
    if (2==pass_)
      const_term_ += c;
  }
}